

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  if (self->state == 3) {
    if (src == 0x6c41) {
      if (type != 5) {
        if (*(int *)&self[1].fn != 6) goto LAB_001225b7;
        if (type == 6) {
          *(undefined4 *)&self[1].fn = 7;
        }
      }
    }
    else {
      if (src != -2) {
LAB_00122577:
        if (*(int *)&self[1].fn == 6) {
          nn_backtrace_print();
          uVar1 = *(uint *)&self[1].fn;
          pcVar3 = "Unexpected source";
          uVar4 = 0x109;
        }
        else {
LAB_001225b7:
          nn_backtrace_print();
          uVar1 = *(uint *)&self[1].fn;
          pcVar3 = "Unexpected state";
          uVar4 = 0x10c;
        }
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,(ulong)uVar1,
                (ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
                ,uVar4);
        goto LAB_001224e3;
      }
      if (type != 5) {
        if (type != -3) goto LAB_00122577;
        if ((*(uint *)&self[1].fn | 4) == 5) {
          *(undefined4 *)&self[1].fn = 7;
        }
        else {
          nn_pipebase_stop((nn_pipebase *)&self[1].state);
          if (self->state - 4U < 0xfffffffe) {
            nn_backtrace_print();
            pcVar3 = "self->fsm.state == 2 || self->fsm.state == 3";
            uVar4 = 0xe5;
            goto LAB_001224dc;
          }
          nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                         (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                         self);
          *(undefined4 *)&self[1].fn = 6;
        }
      }
    }
    if (*(int *)&self[1].fn != 7) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
    if (iVar2 == 0) {
      iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
      if (iVar2 == 0) {
        nn_fsm_stopped(self,7);
        return;
      }
      nn_backtrace_print();
      pcVar3 = "!nn_fsm_event_active (&sinproc->event_sent)";
      uVar4 = 0x12d;
    }
    else {
      nn_backtrace_print();
      pcVar3 = "!nn_fsm_event_active (&sinproc->event_connect)";
      uVar4 = 300;
    }
  }
  else {
    nn_backtrace_print();
    pcVar3 = "sinproc->fsm.state == 3";
    uVar4 = 0x118;
  }
LAB_001224dc:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/sinproc.c"
          ,uVar4);
LAB_001224e3:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}